

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool do_vfp_2op_sp(DisasContext_conflict1 *s,VFPGen2OpSPFn_conflict *fn,int vd,int vm)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_i32 var_00;
  TCGv_i32 fd;
  TCGv_i32 f0;
  int local_38;
  int veclen;
  uint32_t delta_d;
  uint32_t delta_m;
  TCGContext_conflict1 *tcg_ctx;
  int vm_local;
  int vd_local;
  VFPGen2OpSPFn_conflict *fn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  veclen = 0;
  local_38 = 0;
  f0._4_4_ = s->vec_len;
  _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
  if (!_Var1) {
    return false;
  }
  _Var1 = isar_feature_aa32_fpshvec(s->isar);
  if ((!_Var1) && ((f0._4_4_ != 0 || (s->vec_stride != 0)))) {
    return false;
  }
  _Var1 = vfp_access_check(s);
  if (!_Var1) {
    return true;
  }
  if (0 < f0._4_4_) {
    _Var1 = vfp_sreg_is_scalar(vd);
    if (_Var1) {
      f0._4_4_ = 0;
    }
    else {
      local_38 = s->vec_stride + 1;
      _Var1 = vfp_sreg_is_scalar(vm);
      veclen = local_38;
      if (_Var1) {
        veclen = 0;
      }
    }
  }
  var = tcg_temp_new_i32(tcg_ctx_00);
  var_00 = tcg_temp_new_i32(tcg_ctx_00);
  neon_load_reg32(tcg_ctx_00,var,vm);
  tcg_ctx._0_4_ = vm;
  tcg_ctx._4_4_ = vd;
  while( true ) {
    (*fn)(tcg_ctx_00,var_00,var);
    neon_store_reg32(tcg_ctx_00,var_00,tcg_ctx._4_4_);
    if (f0._4_4_ == 0) break;
    if (veclen == 0) goto LAB_007aeebe;
    f0._4_4_ = f0._4_4_ + -1;
    tcg_ctx._4_4_ = vfp_advance_sreg(tcg_ctx._4_4_,local_38);
    tcg_ctx._0_4_ = vfp_advance_sreg((int)tcg_ctx,veclen);
    neon_load_reg32(tcg_ctx_00,var,(int)tcg_ctx);
  }
LAB_007aef2a:
  tcg_temp_free_i32(tcg_ctx_00,var);
  tcg_temp_free_i32(tcg_ctx_00,var_00);
  return true;
LAB_007aeebe:
  while (f0._4_4_ != 0) {
    tcg_ctx._4_4_ = vfp_advance_sreg(tcg_ctx._4_4_,local_38);
    neon_store_reg32(tcg_ctx_00,var_00,tcg_ctx._4_4_);
    f0._4_4_ = f0._4_4_ + -1;
  }
  goto LAB_007aef2a;
}

Assistant:

static bool do_vfp_2op_sp(DisasContext *s, VFPGen2OpSPFn *fn, int vd, int vm)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 f0, fd;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;

            if (vfp_sreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i32(tcg_ctx);
    fd = tcg_temp_new_i32(tcg_ctx);

    neon_load_reg32(tcg_ctx, f0, vm);

    for (;;) {
        fn(tcg_ctx, fd, f0);
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        if (delta_m == 0) {
            /* single source one-many */
            while (veclen--) {
                vd = vfp_advance_sreg(vd, delta_d);
                neon_store_reg32(tcg_ctx, fd, vd);
            }
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
        vm = vfp_advance_sreg(vm, delta_m);
        neon_load_reg32(tcg_ctx, f0, vm);
    }

    tcg_temp_free_i32(tcg_ctx, f0);
    tcg_temp_free_i32(tcg_ctx, fd);

    return true;
}